

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::conditionalOperator(Thread *this)

{
  bool bVar1;
  EvaluateValueResult EVar2;
  ReferenceValueType RVar3;
  int iVar4;
  reference pvVar5;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *pvVar6;
  reference ppTVar7;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *node_00;
  RuntimeException *this_00;
  int local_ac;
  element_type *local_a8;
  size_type local_a0;
  size_t nextIndex;
  pointer pbStack_90;
  pointer local_88;
  allocator local_69;
  string local_68;
  Reference local_48;
  Reference ref;
  element_type *local_38;
  unsigned_long *local_30;
  unsigned_long *nodePhase;
  Node *node;
  value_type *f;
  Thread *this_local;
  
  f = (value_type *)this;
  node = (Node *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  pvVar5 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back(&((reference)node)->stack);
  nodePhase = (unsigned_long *)pvVar5->first;
  pvVar5 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   *)&node->annotations);
  local_30 = &pvVar5->second;
  if (*local_30 == 0) {
    *local_30 = *local_30 + 1;
    pvVar6 = &node->annotations;
    p_Var8 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),0)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_38 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
    ref.node._4_4_ = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar6,&local_38,(int *)((long)&ref.node + 4));
    return true;
  }
  if (*local_30 == 1) {
    EVar2 = evaluateValue(this,Value);
    if (EVar2 == Suspend) {
      return false;
    }
    if (EVar2 == StackChanged) {
      return true;
    }
  }
  ppTVar7 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::back
                      ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                        *)&node->additionalTokens);
  local_48 = TemporaryObject::getRef(*ppTVar7);
  RVar3 = Reference::valueType(&local_48);
  if (RVar3 == Bool) {
    bVar1 = Reference::getBool(&local_48);
    iVar4 = 2;
    if (bVar1) {
      iVar4 = 1;
    }
    local_a0 = (size_type)iVar4;
    Frame::pop((Frame *)node);
    std::
    vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                *)&node->annotations);
    pvVar6 = &node->annotations;
    p_Var8 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),local_a0)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_a8 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
    local_ac = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar6,&local_a8,&local_ac);
    return true;
  }
  p_Var8 = &std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)(nodePhase + 0xc),0)->
            super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
  node_00 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"conditional operator requires Bool expression",&local_69);
  nextIndex = 0;
  pbStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&nextIndex);
  errorAtNode(&this->super_IErrorReceiver,Error,node_00,&local_68,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&nextIndex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nextIndex);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x10);
  RuntimeException::RuntimeException(this_00,TypeMismatchException);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

bool Thread::conditionalOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  CHATRA_EVALUATE_VALUE;
	default: {
		auto ref = f.values.back()->getRef();
		if (ref.valueType() != ReferenceValueType::Bool) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(),
					"conditional operator requires Bool expression", {});
			throw RuntimeException(StringId::TypeMismatchException);
		}
		size_t nextIndex = (ref.getBool() ? 1 : 2);
		f.pop();
		f.stack.pop_back();
		f.stack.emplace_back(node->subNodes[nextIndex].get(), 0);
		return true;
	}
	}
}